

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_scope.c
# Opt level: O0

scope_stack_ptr scope_stack_push(scope sp,size_t bytes)

{
  int iVar1;
  size_t sVar2;
  size_t *psVar3;
  scope in_RSI;
  long in_RDI;
  void **prev_ptr;
  scope_stack_ptr next_size;
  scope_stack_ptr prev_size;
  scope_stack_ptr *return_ptr;
  vector in_stack_ffffffffffffffc8;
  long lVar4;
  scope_stack_ptr local_8;
  
  if (((in_RDI == 0) || (*(long *)(in_RDI + 0x10) == 0)) || (in_RSI == (scope)0x0)) {
    log_write_impl_va("metacall",0x22a,"scope_stack_push",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                      ,LOG_LEVEL_ERROR,"Scope stack push invalid parameters");
    local_8 = 1;
  }
  else {
    sVar2 = vector_size(*(vector *)(in_RDI + 0x10));
    lVar4 = (long)&in_RSI->objects + sVar2;
    iVar1 = vector_resize(in_stack_ffffffffffffffc8,0x1299d8);
    if (iVar1 == 0) {
      psVar3 = scope_stack_return(in_RSI);
      if (psVar3 != (size_t *)0x0) {
        in_stack_ffffffffffffffc8 = (vector)vector_at(in_stack_ffffffffffffffc8,0x129a43);
        if ((in_stack_ffffffffffffffc8 != (vector)0x0) &&
           (in_stack_ffffffffffffffc8->type_size != 0)) {
          *psVar3 = sVar2;
          return sVar2;
        }
        log_write_impl_va("metacall",0x21d,"scope_stack_push",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                          ,LOG_LEVEL_ERROR,"Scope stack push bad stack pointer reference",
                          in_stack_ffffffffffffffc8,lVar4);
      }
      log_write_impl_va("metacall",0x220,"scope_stack_push",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                        ,LOG_LEVEL_ERROR,"Scope stack push bad stack return reference");
      iVar1 = vector_resize(in_stack_ffffffffffffffc8,0x129ae3);
      if (iVar1 != 0) {
        log_write_impl_va("metacall",0x224,"scope_stack_push",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                          ,LOG_LEVEL_ERROR,"Scope stack push bad call stack size decrease");
      }
      local_8 = 0;
    }
    else {
      log_write_impl_va("metacall",0x20b,"scope_stack_push",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                        ,LOG_LEVEL_ERROR,"Scope stack push bad call stack size increase");
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

scope_stack_ptr scope_stack_push(scope sp, size_t bytes)
{
	if (sp != NULL && sp->call_stack != NULL && bytes > 0)
	{
		scope_stack_ptr *return_ptr = NULL;

		scope_stack_ptr prev_size = vector_size(sp->call_stack);

		scope_stack_ptr next_size = prev_size + bytes + sizeof(size_t);

		if (vector_resize(sp->call_stack, next_size) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Scope stack push bad call stack size increase");

			return 0;
		}

		return_ptr = scope_stack_return(sp);

		if (return_ptr != NULL)
		{
			void **prev_ptr = vector_at(sp->call_stack, prev_size);

			if (prev_ptr != NULL && *prev_ptr != NULL)
			{
				*return_ptr = prev_size;

				return prev_size;
			}

			log_write("metacall", LOG_LEVEL_ERROR, "Scope stack push bad stack pointer reference");
		}

		log_write("metacall", LOG_LEVEL_ERROR, "Scope stack push bad stack return reference");

		if (vector_resize(sp->call_stack, prev_size) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Scope stack push bad call stack size decrease");
		}

		return 0;
	}

	log_write("metacall", LOG_LEVEL_ERROR, "Scope stack push invalid parameters");

	return 1;
}